

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O3

Abc_Cex_t * Ssw_SmlGetCounterExample(Ssw_Sml_t *p)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  long lVar3;
  Abc_Cex_t *p_00;
  uint uVar4;
  int iVar5;
  int i;
  int iVar6;
  int iVar7;
  Abc_Cex_t *format;
  Aig_Man_t *pAVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  
  if (p->fNonConstOut == 0) {
    __assert_fail("p->fNonConstOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                  ,0x542,"Abc_Cex_t *Ssw_SmlGetCounterExample(Ssw_Sml_t *)");
  }
  pAVar8 = p->pAig;
  uVar4 = pAVar8->nTruePos;
  iVar2 = -1;
  if ((long)(int)uVar4 < 1) {
    uVar11 = 0;
  }
  else {
    uVar10 = pAVar8->vCos->nSize;
    uVar11 = 0;
    uVar9 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar9 = uVar11;
    }
    do {
      if (uVar11 == uVar9) goto LAB_006b3ced;
      iVar6 = p->nWordsTotal;
      iVar5 = p->nWordsPref;
      lVar3 = (long)iVar5;
      if (iVar5 < iVar6) {
        iVar7 = *(int *)((long)pAVar8->vCos->pArray[uVar11] + 0x24);
        lVar12 = 0;
        do {
          if (*(int *)((long)&p[1].pAig + lVar12 * 4 + (long)(iVar6 * iVar7) * 4 + lVar3 * 4) != 0)
          {
            lVar12 = 0;
            goto LAB_006b3b14;
          }
          lVar12 = lVar12 + 1;
        } while (iVar6 - iVar5 != (int)lVar12);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != (long)(int)uVar4);
    uVar11 = (ulong)uVar4;
  }
  goto LAB_006b3b29;
  while (uVar10 = uVar10 + 1, uVar10 != 0x20) {
LAB_006b3b3e:
    if ((uVar4 >> (uVar10 & 0x1f) & 1) != 0) goto LAB_006b3b4f;
  }
  uVar10 = 0xffffffff;
LAB_006b3b4f:
  iVar6 = uVar10 + (iVar5 % p->nWordsFrame) * 0x20;
  goto LAB_006b3b51;
  while (lVar12 = lVar12 + 1, iVar6 - lVar3 != lVar12) {
LAB_006b3b14:
    uVar4 = *(uint *)((long)&p[1].pAig + lVar12 * 4 + (long)(iVar7 * iVar6) * 4 + lVar3 * 4);
    if (uVar4 != 0) {
      iVar5 = iVar5 + (int)lVar12;
      iVar2 = iVar5 / p->nWordsFrame;
      uVar10 = 0;
      goto LAB_006b3b3e;
    }
  }
LAB_006b3b29:
  iVar6 = -1;
LAB_006b3b51:
  iVar5 = pAVar8->nRegs;
  if (pAVar8->nObjs[3] - iVar5 <= (int)uVar11) {
    __assert_fail("iPo < Aig_ManCoNum(p->pAig)-Aig_ManRegNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                  ,0x556,"Abc_Cex_t *Ssw_SmlGetCounterExample(Ssw_Sml_t *)");
  }
  if (p->nFrames <= iVar2) {
    __assert_fail("iFrame < p->nFrames",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                  ,0x557,"Abc_Cex_t *Ssw_SmlGetCounterExample(Ssw_Sml_t *)");
  }
  if (p->nWordsFrame * 0x20 <= iVar6) {
    __assert_fail("iBit < 32 * p->nWordsFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                  ,0x558,"Abc_Cex_t *Ssw_SmlGetCounterExample(Ssw_Sml_t *)");
  }
  p_00 = Abc_CexAlloc(iVar5,pAVar8->nObjs[2] - iVar5,iVar2 + 1);
  p_00->iPo = (int)uVar11;
  p_00->iFrame = iVar2;
  pAVar8 = p->pAig;
  iVar5 = pAVar8->nRegs;
  if (0 < iVar5) {
    pVVar1 = pAVar8->vCis;
    uVar4 = 0;
    do {
      uVar10 = pAVar8->nTruePis + uVar4;
      if (((int)uVar10 < 0) || (pVVar1->nSize <= (int)uVar10)) {
LAB_006b3ced:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if ((*(uint *)((long)&p[1].pAig +
                    (long)p->nWordsTotal * (long)*(int *)((long)pVVar1->pArray[uVar10] + 0x24) * 4 +
                    (long)(iVar6 >> 5) * 4) & 1 << ((byte)iVar6 & 0x1f)) != 0) {
        (&p_00[1].iPo)[uVar4 >> 5] = (&p_00[1].iPo)[uVar4 >> 5] | 1 << ((byte)uVar4 & 0x1f);
        iVar5 = pAVar8->nRegs;
      }
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 < iVar5);
  }
  if (-1 < iVar2) {
    iVar5 = pAVar8->nTruePis;
    iVar7 = 0;
    do {
      if (0 < iVar5) {
        pVVar1 = pAVar8->vCis;
        lVar3 = 0;
        do {
          if (pVVar1->nSize <= lVar3) goto LAB_006b3ced;
          if ((*(uint *)((long)&p[1].pAig +
                        (long)(p->nWordsFrame * iVar7 * 0x20 + iVar6 >> 5) * 4 +
                        (long)p->nWordsTotal * (long)*(int *)((long)pVVar1->pArray[lVar3] + 0x24) *
                        4) & 1 << ((byte)iVar6 & 0x1f)) != 0) {
            iVar5 = p_00->nPis * iVar7 + p_00->nRegs + (int)lVar3;
            (&p_00[1].iPo)[iVar5 >> 5] = (&p_00[1].iPo)[iVar5 >> 5] | 1 << ((byte)iVar5 & 0x1f);
            iVar5 = pAVar8->nTruePis;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < iVar5);
      }
      bVar13 = iVar7 != iVar2;
      iVar7 = iVar7 + 1;
    } while (bVar13);
  }
  format = p_00;
  iVar2 = Saig_ManVerifyCex(pAVar8,p_00);
  if (iVar2 == 0) {
    Abc_Print((int)pAVar8,(char *)format);
    Abc_CexFree(p_00);
    p_00 = (Abc_Cex_t *)0x0;
  }
  return p_00;
}

Assistant:

Abc_Cex_t * Ssw_SmlGetCounterExample( Ssw_Sml_t * p )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    unsigned * pSims;
    int iPo, iFrame, iBit, i, k;

    // make sure the simulation manager has it
    assert( p->fNonConstOut );

    // find the first output that failed
    iPo = -1;
    iBit = -1;
    iFrame = -1;
    Saig_ManForEachPo( p->pAig, pObj, iPo )
    {
        if ( Ssw_SmlNodeIsZero(p, pObj) )
            continue;
        pSims = Ssw_ObjSim( p, pObj->Id );
        for ( i = p->nWordsPref; i < p->nWordsTotal; i++ )
            if ( pSims[i] )
            {
                iFrame = i / p->nWordsFrame;
                iBit = 32 * (i % p->nWordsFrame) + Aig_WordFindFirstBit( pSims[i] );
                break;
            }
        break;
    }
    assert( iPo < Aig_ManCoNum(p->pAig)-Aig_ManRegNum(p->pAig) );
    assert( iFrame < p->nFrames );
    assert( iBit < 32 * p->nWordsFrame );

    // allocate the counter example
    pCex = Abc_CexAlloc( Aig_ManRegNum(p->pAig), Aig_ManCiNum(p->pAig) - Aig_ManRegNum(p->pAig), iFrame + 1 );
    pCex->iPo    = iPo;
    pCex->iFrame = iFrame;

    // copy the bit data
    Saig_ManForEachLo( p->pAig, pObj, k )
    {
        pSims = Ssw_ObjSim( p, pObj->Id );
        if ( Abc_InfoHasBit( pSims, iBit ) )
            Abc_InfoSetBit( pCex->pData, k );
    }
    for ( i = 0; i <= iFrame; i++ )
    {
        Saig_ManForEachPi( p->pAig, pObj, k )
        {
            pSims = Ssw_ObjSim( p, pObj->Id );
            if ( Abc_InfoHasBit( pSims, 32 * p->nWordsFrame * i + iBit ) )
                Abc_InfoSetBit( pCex->pData, pCex->nRegs + pCex->nPis * i + k );
        }
    }
    // verify the counter example
    if ( !Saig_ManVerifyCex( p->pAig, pCex ) )
    {
        Abc_Print( 1, "Ssw_SmlGetCounterExample(): Counter-example is invalid.\n" );
        Abc_CexFree( pCex );
        pCex = NULL;
    }
    return pCex;
}